

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O0

void __thiscall juzzlin::SimpleLogger::Impl::Impl(Impl *this,string *tag)

{
  string *in_RSI;
  lock_guard<std::recursive_mutex> *in_RDI;
  
  *(undefined4 *)&in_RDI->_M_device = 2;
  std::lock_guard<std::recursive_mutex>::lock_guard(in_RDI,(mutex_type *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RSI);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(in_RDI + 6));
  return;
}

Assistant:

SimpleLogger::Impl::Impl(const std::string & tag)
  : m_lock(m_mutex)
  , m_tag(tag)
{
}